

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

void do_jobs(pmtr_t *cfg)

{
  long lVar1;
  __pid_t _Var2;
  int iVar3;
  time_t tVar4;
  passwd *ppVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  char **local_210;
  char *local_208;
  char *local_200;
  char **local_1f8;
  __rlimit_resource_t *local_1f0;
  ulong local_1e8;
  ulong local_1d0;
  __rlimit_resource_t *local_1c0;
  __rlimit_resource_t *local_1b8;
  job_t *local_1b0;
  ulong local_1a8;
  ulong local_190;
  job_t *local_180;
  job_t *local_178;
  job_t *local_168;
  ulong local_160;
  ulong local_148;
  job_t *local_138;
  job_t *local_130;
  int flags_wr;
  passwd *p;
  sigset_t none;
  rlimit new_limit;
  resource_rlimit_t *rt;
  job_t *job;
  char **env;
  char **argv;
  char *i;
  char *e;
  char *o;
  char *pathname;
  int local_40;
  int ds;
  int rc;
  int fi;
  int fe;
  int fo;
  int n;
  int es;
  time_t elapsed;
  time_t now;
  pmtr_t *ppStack_10;
  pid_t pid;
  pmtr_t *cfg_local;
  
  rt = (resource_rlimit_t *)0x0;
  ppStack_10 = cfg;
  while( true ) {
    while( true ) {
      do {
        while( true ) {
          if (rt == (resource_rlimit_t *)0x0) {
            if (ppStack_10->jobs->i == 0) {
              local_130 = (job_t *)0x0;
            }
            else {
              local_130 = (job_t *)ppStack_10->jobs->d;
            }
            local_138 = local_130;
          }
          else {
            if (rt < (resource_rlimit_t *)ppStack_10->jobs->d) {
              local_148 = 0xffffffffffffffff;
            }
            else {
              local_148 = (ulong)((long)rt - (long)ppStack_10->jobs->d) / (ppStack_10->jobs->icd).sz
              ;
            }
            if (local_148 + 1 < (ulong)ppStack_10->jobs->i) {
              if (rt < (resource_rlimit_t *)ppStack_10->jobs->d) {
                local_160 = 0xffffffffffffffff;
              }
              else {
                local_160 = (ulong)((long)rt - (long)ppStack_10->jobs->d) /
                            (ppStack_10->jobs->icd).sz;
              }
              local_168 = (job_t *)(ppStack_10->jobs->d +
                                   (ppStack_10->jobs->icd).sz * (local_160 + 1));
            }
            else {
              local_168 = (job_t *)0x0;
            }
            local_138 = local_168;
          }
          rt = (resource_rlimit_t *)local_138;
          if (local_138 == (job_t *)0x0) {
            return;
          }
          if ((local_138->bounce_interval != 0) && (local_138->pid != 0)) {
            elapsed = time((time_t *)0x0);
            _n = elapsed - local_138->start_ts;
            if ((local_138->bounce_interval <= _n) && (local_138->terminate == 0)) {
              local_138->terminate = 1;
            }
          }
          if (local_138->terminate == 0) break;
          signal_job(local_138);
        }
      } while (((local_138->disabled != 0) || (local_138->pid != 0)) || (local_138->respawn == 0));
      lVar1 = local_138->start_at;
      tVar4 = time(&elapsed);
      if (lVar1 <= tVar4) break;
      alarm_within(ppStack_10,(int)local_138->start_at - (int)elapsed);
    }
    now._4_4_ = fork();
    if (now._4_4_ == -1) {
      syslog(3,"fork error\n");
      _Var2 = getpid();
      kill(_Var2,0xf);
      return;
    }
    if (now._4_4_ < 1) break;
    local_138->pid = now._4_4_;
    tVar4 = time((time_t *)0x0);
    local_138->start_ts = tVar4;
    syslog(6,"started job %s [%d]",local_138->name,(ulong)(uint)local_138->pid);
    if (local_138->wait != 0) {
      syslog(6,"pausing for job %s to finish",local_138->name);
      _Var2 = waitpid(local_138->pid,&fo,0);
      if (_Var2 == local_138->pid) {
        syslog(6,"job %s finished",local_138->name);
        if (((fo & 0x7fU) == 0) && ((int)(fo & 0xff00U) >> 8 == 0x21)) {
          local_138->respawn = 0;
        }
        else if (local_138->once != 0) {
          local_138->respawn = 0;
        }
        local_138->pid = 0;
      }
      else {
        syslog(3,"waitpid for job %s failed\n",local_138->name);
      }
    }
  }
  if (now._4_4_ != 0) {
    __assert_fail("pid == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/job.c",
                  0x25a,"void do_jobs(pmtr_t *)");
  }
  if ((local_138->dir == (char *)0x0) || (iVar3 = chdir(local_138->dir), iVar3 != -1)) {
    closelog();
    job = (job_t *)0x0;
    while( true ) {
      if (job == (job_t *)0x0) {
        if ((local_138->envv).i == 0) {
          local_178 = (job_t *)0x0;
        }
        else {
          local_178 = (job_t *)(local_138->envv).d;
        }
        local_180 = local_178;
      }
      else {
        if (job < (job_t *)(local_138->envv).d) {
          local_190 = 0xffffffffffffffff;
        }
        else {
          local_190 = (ulong)((long)job - (long)(local_138->envv).d) / (local_138->envv).icd.sz;
        }
        if (local_190 + 1 < (ulong)(local_138->envv).i) {
          if (job < (job_t *)(local_138->envv).d) {
            local_1a8 = 0xffffffffffffffff;
          }
          else {
            local_1a8 = (ulong)((long)job - (long)(local_138->envv).d) / (local_138->envv).icd.sz;
          }
          local_1b0 = (job_t *)((local_138->envv).d + (local_138->envv).icd.sz * (local_1a8 + 1));
        }
        else {
          local_1b0 = (job_t *)0x0;
        }
        local_180 = local_1b0;
      }
      job = local_180;
      if (local_180 == (job_t *)0x0) break;
      putenv(local_180->name);
    }
    iVar3 = setpriority(PRIO_PROCESS,0,local_138->nice);
    if (iVar3 < 0) {
      local_40 = -5;
    }
    else {
      iVar3 = __sched_cpucount(0x80,(cpu_set_t *)&local_138->cpuset);
      if ((iVar3 < 1) ||
         (iVar3 = sched_setaffinity(0,0x80,(cpu_set_t *)&local_138->cpuset), iVar3 == 0)) {
        new_limit.rlim_max = 0;
        do {
          if (new_limit.rlim_max == 0) {
            if ((local_138->rlim).i == 0) {
              local_1b8 = (__rlimit_resource_t *)0x0;
            }
            else {
              local_1b8 = (__rlimit_resource_t *)(local_138->rlim).d;
            }
            local_1c0 = local_1b8;
          }
          else {
            if (new_limit.rlim_max < (local_138->rlim).d) {
              local_1d0 = 0xffffffffffffffff;
            }
            else {
              local_1d0 = (new_limit.rlim_max - (long)(local_138->rlim).d) /
                          (local_138->rlim).icd.sz;
            }
            if (local_1d0 + 1 < (ulong)(local_138->rlim).i) {
              if (new_limit.rlim_max < (local_138->rlim).d) {
                local_1e8 = 0xffffffffffffffff;
              }
              else {
                local_1e8 = (new_limit.rlim_max - (long)(local_138->rlim).d) /
                            (local_138->rlim).icd.sz;
              }
              local_1f0 = (__rlimit_resource_t *)
                          ((local_138->rlim).d + (local_138->rlim).icd.sz * (local_1e8 + 1));
            }
            else {
              local_1f0 = (__rlimit_resource_t *)0x0;
            }
            local_1c0 = local_1f0;
          }
          new_limit.rlim_max = (rlim_t)local_1c0;
          if (local_1c0 == (__rlimit_resource_t *)0x0) {
            for (fe = 0; (uint)fe < 8; fe = fe + 1) {
              signal(sigs[fe],(__sighandler_t)0x0);
            }
            sigemptyset((sigset_t *)&p);
            sigprocmask(2,(sigset_t *)&p,(sigset_t *)0x0);
            if (local_138->user[0] != '\0') {
              ppVar5 = getpwnam(local_138->user);
              if (ppVar5 == (passwd *)0x0) {
                local_40 = -7;
                goto LAB_001078a4;
              }
              iVar3 = setgid(ppVar5->pw_gid);
              if (iVar3 == -1) {
                local_40 = -8;
                goto LAB_001078a4;
              }
              iVar3 = initgroups(local_138->user,ppVar5->pw_gid);
              if (iVar3 == -1) {
                local_40 = -9;
                goto LAB_001078a4;
              }
              iVar3 = setuid(ppVar5->pw_uid);
              if (iVar3 == -1) {
                local_40 = -10;
                goto LAB_001078a4;
              }
            }
            if (local_138->in == (char *)0x0) {
              local_1f8 = (char **)0x110518;
            }
            else {
              local_1f8 = (char **)local_138->in;
            }
            argv = local_1f8;
            if (local_138->out == (char *)0x0) {
              local_200 = "syslog";
            }
            else {
              local_200 = local_138->out;
            }
            e = local_200;
            if (local_138->err == (char *)0x0) {
              local_208 = "syslog";
            }
            else {
              local_208 = local_138->err;
            }
            i = local_208;
            iVar3 = redirect(ppStack_10,0,(char *)local_1f8,0,0);
            if (iVar3 < 0) {
              local_40 = -2;
            }
            else {
              iVar3 = redirect(ppStack_10,1,local_200,0x441,0x1a4);
              if (iVar3 < 0) {
                local_40 = -3;
              }
              else {
                iVar3 = redirect(ppStack_10,2,local_208,0x441,0x1a4);
                if (iVar3 < 0) {
                  local_40 = -4;
                }
                else {
                  if ((local_138->cmdv).i == 0) {
                    local_210 = (char **)0x0;
                  }
                  else {
                    local_210 = (char **)(local_138->cmdv).d;
                  }
                  o = *local_210;
                  iVar3 = execv(o,local_210);
                  if (iVar3 != -1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/job.c"
                                  ,0x294,"void do_jobs(pmtr_t *)");
                  }
                  local_40 = -0xb;
                }
              }
            }
            goto LAB_001078a4;
          }
          none.__val[0xf] = *(unsigned_long *)(local_1c0 + 2);
          iVar3 = setrlimit(*local_1c0,(rlimit *)(none.__val + 0xf));
        } while (iVar3 == 0);
        local_40 = -6;
      }
      else {
        local_40 = -0xc;
      }
    }
  }
  else {
    local_40 = -1;
  }
LAB_001078a4:
  if (local_40 == -1) {
    pcVar8 = local_138->dir;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    syslog(3,"can\'t chdir %s: %s",pcVar8,pcVar7);
  }
  if (local_40 == -2) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t open/dup %s: %s",argv,pcVar8);
  }
  if (local_40 == -3) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t open/dup %s: %s",e,pcVar8);
  }
  if (local_40 == -4) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t open/dup %s: %s",i,pcVar8);
  }
  if (local_40 == -5) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t setpriority: %s",pcVar8);
  }
  if (local_40 == -6) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t setrlimit: %s",pcVar8);
  }
  if (local_40 == -7) {
    syslog(3,"unknown user: %s",local_138->user);
  }
  if (local_40 == -8) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t setgid %s: %s",local_138->user,pcVar8);
  }
  if (local_40 == -9) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t initgroups %s: %s",local_138->user,pcVar8);
  }
  if (local_40 == -10) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t setuid %s: %s",local_138->user,pcVar8);
  }
  if (local_40 == -0xb) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t exec %s: %s",o,pcVar8);
  }
  if (local_40 == -0xc) {
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    syslog(3,"can\'t set cpu affinity: %s",pcVar8);
  }
  exit(-1);
}

Assistant:

void do_jobs(pmtr_t *cfg) {
  pid_t pid;
  time_t now, elapsed;
  int es, n, fo, fe, fi, rc=-1, ds;
  char *pathname, *o, *e, *i, **argv, **env;

  job_t *job = NULL;
  while ( (job = (job_t*)utarray_next(cfg->jobs,job))) {
    if (job->bounce_interval && job->pid) { 
      now = time(NULL);
      elapsed = now - job->start_ts;
      if (elapsed >= job->bounce_interval) {
        if (job->terminate==0) job->terminate=1;
      }
    }
    if (job->terminate) {signal_job(job); continue;}
    if (job->disabled) continue;
    if (job->pid) continue;  /* running already */
    if (job->respawn == 0) continue;  /* don't respawn */
    if (job->start_at > time(&now)) {  /* not yet */
      alarm_within(cfg, job->start_at - now);
      continue;
    }

    pid = fork();

    if (pid == -1) {
      syslog(LOG_ERR,"fork error\n");
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      return;
    }

    if (pid > 0) {  /* parent */
      job->pid = pid;
      job->start_ts = time(NULL);
      syslog(LOG_INFO,"started job %s [%d]", job->name, (int)job->pid);
      /* support the 'wait' feature which pauses (blocks) for a job to finish.*/
      if (job->wait) {
        syslog(LOG_INFO,"pausing for job %s to finish",job->name);
        if (waitpid(job->pid, &es, 0) != job->pid) {
          syslog(LOG_ERR,"waitpid for job %s failed\n",job->name);
          continue;
        }
        syslog(LOG_INFO,"job %s finished",job->name);
        if (WIFEXITED(es) && (WEXITSTATUS(es) == PMTR_NO_RESTART)) job->respawn=0;
        else if (job->once) job->respawn=0;
        job->pid = 0;
      }
      continue;
    }

    /*********************************************************************
     * child here 
     ********************************************************************/
    assert(pid == 0);

    /* setup working dir */
    if (job->dir && (chdir(job->dir) == -1))                 {rc=-1; goto fail;}

    /* close inherited descriptors */
    closelog(); 

    /* set environment variables */
    env=NULL;
    while ( (env=(char**)utarray_next(&job->envv,env))) putenv(*env);

    /* set process priority / nice */
    if (setpriority(PRIO_PROCESS, 0, job->nice) < 0)         {rc=-5; goto fail;}

    /* set cpu affinity, if any */
    if ((CPU_COUNT(&job->cpuset) > 0) &&
      sched_setaffinity(0, sizeof(cpu_set_t), &job->cpuset)) {rc=-12; goto fail;}

    /* set ulimits */
    resource_rlimit_t *rt=NULL;
    while ( (rt=(resource_rlimit_t*)utarray_next(&job->rlim,rt))) {
      struct rlimit new_limit = {.rlim_cur=rt->rlim.rlim_cur,
                                 .rlim_max=rt->rlim.rlim_max};
      if (setrlimit(rt->id, &new_limit))                     {rc=-6; goto fail;}
    }

    /* restore/unblock default handlers so they're unblocked after exec */
    for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) signal(sigs[n], SIG_DFL);
    sigset_t none;
    sigemptyset(&none);
    sigprocmask(SIG_SETMASK,&none,NULL);

    /* change the real and effective user ids, and set the gid and supp groups */
    if (*job->user) {
      struct passwd *p;
      if ( (p = getpwnam(job->user)) == NULL)                {rc=-7; goto fail;}
      if (setgid(p->pw_gid) == -1)                           {rc=-8; goto fail;}
      if (initgroups(job->user, p->pw_gid) == -1)            {rc=-9; goto fail;}
      if (setuid(p->pw_uid) == -1)                           {rc=-10; goto fail;}
    }

    /* redirect the child's stdout and stderr to syslog unless user specified */
    i = job->in  ? job->in  : "/dev/null";
    o = job->out ? job->out : "syslog";
    e = job->err ? job->err : "syslog";

    int flags_wr = O_WRONLY|O_CREAT|O_APPEND;
    if (redirect(cfg, STDIN_FILENO,  i, O_RDONLY, 0)    < 0) { rc=-2; goto fail;}
    if (redirect(cfg, STDOUT_FILENO, o, flags_wr, 0644) < 0) { rc=-3; goto fail;}
    if (redirect(cfg, STDERR_FILENO, e, flags_wr, 0644) < 0) { rc=-4; goto fail;}

    /* at last. we're ready to run the child process */
    argv = (char**)utarray_front(&job->cmdv);
    pathname = *argv;
    if (execv(pathname, argv) == -1)                         {rc=-11; goto fail;}

    /* not reached - child has exec'd */
    assert(0); 

   fail:
    if (rc==-1) syslog(LOG_ERR,"can't chdir %s: %s", job->dir, strerror(errno));
    if (rc==-2) syslog(LOG_ERR,"can't open/dup %s: %s", i, strerror(errno));
    if (rc==-3) syslog(LOG_ERR,"can't open/dup %s: %s", o, strerror(errno));
    if (rc==-4) syslog(LOG_ERR,"can't open/dup %s: %s", e, strerror(errno));
    if (rc==-5) syslog(LOG_ERR,"can't setpriority: %s", strerror(errno));
    if (rc==-6) syslog(LOG_ERR,"can't setrlimit: %s", strerror(errno));
    if (rc==-7) syslog(LOG_ERR,"unknown user: %s", job->user);
    if (rc==-8) syslog(LOG_ERR,"can't setgid %s: %s", job->user, strerror(errno));
    if (rc==-9) syslog(LOG_ERR,"can't initgroups %s: %s", job->user, strerror(errno));
    if (rc==-10) syslog(LOG_ERR,"can't setuid %s: %s", job->user, strerror(errno));
    if (rc==-11) syslog(LOG_ERR,"can't exec %s: %s", pathname, strerror(errno));
    if (rc==-12) syslog(LOG_ERR,"can't set cpu affinity: %s", strerror(errno));
    exit(-1);  /* child exit */
  }
}